

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O2

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkDirFrame::GetConstraintViolation(ChLinkDirFrame *this)

{
  Index extraout_RDX;
  long in_RSI;
  ChVectorDynamic<> CVar1;
  ChVectorN<double,_2> C;
  ChVector<double> res;
  ChMatrix33<double> Arw;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_98;
  double dStack_90;
  ChQuaternion<double> local_88;
  ChMatrix33<double> local_68;
  
  ChQuaternion<double>::operator>>
            (&local_88,(ChQuaternion<double> *)(in_RSI + 0x1f8),
             (ChQuaternion<double> *)(*(long *)(in_RSI + 0x1d0) + 0x20));
  ChMatrix33<double>::Set_A_quaternion(&local_68,&local_88);
  local_98.m_matrix = &local_68.super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_98,(ChVector<double> *)(*(long *)(in_RSI + 0x1c0) + 0xf0));
  local_98.m_matrix = (non_const_type)local_88.m_data[1];
  dStack_90 = local_88.m_data[2];
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_98);
  CVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  CVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkDirFrame::GetConstraintViolation() const {
    ChMatrix33<> Arw = m_csys.rot >> m_body->coord.rot;
    ChVector<> res = Arw.transpose() * m_node->GetD();
    ChVectorN<double, 2> C;
    C(0) = res.y();
    C(1) = res.z();
    return C;
}